

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<unsigned_long_long,long_long,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,unsigned_long_long *v,
               unsigned_long_long v_min,unsigned_long_long v_max,char *format,ImGuiSliderFlags flags
               ,ImRect *out_grab_bb)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  float *pfVar4;
  unsigned_long_long *in_RCX;
  float in_EDX;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  ulong in_R8;
  ulong in_R9;
  bool bVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ImVec2 IVar14;
  ImGuiDataType unaff_retaddr;
  undefined4 unaff_retaddr_00;
  float in_stack_00000008;
  ImGuiDataType in_stack_0000000c;
  uint in_stack_00000010;
  undefined8 *in_stack_00000018;
  float grab_pos;
  float grab_t;
  unsigned_long_long v_new_1;
  float new_clicked_t;
  unsigned_long_long v_new;
  float old_clicked_t;
  float delta;
  int decimal_precision_1;
  float input_delta;
  ImVec2 input_delta2;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  int decimal_precision;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  longlong v_range;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  bool is_logarithmic;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  float in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  float in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  float in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  long local_f8;
  bool local_e9;
  undefined8 local_e8;
  float in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  ImGuiInputReadMode in_stack_ffffffffffffff28;
  ImGuiNavDirSourceFlags in_stack_ffffffffffffff2c;
  undefined8 local_d0;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  float local_c0;
  float in_stack_ffffffffffffff44;
  ImVec2 in_stack_ffffffffffffff48;
  unsigned_long_long local_b0;
  float local_88;
  float local_84;
  float fStack_80;
  bool local_71;
  float local_4c;
  float zero_deadzone_halfsize_00;
  
  pIVar2 = GImGui;
  uVar3 = (uint)((in_stack_00000010 & 0x100000) != 0);
  bVar5 = in_EDX == 1.12104e-44;
  bVar6 = in_EDX == 1.26117e-44;
  local_e9 = bVar5 || bVar6;
  bVar1 = false;
  if ((in_stack_00000010 & 0x20) != 0) {
    bVar1 = local_e9;
  }
  fVar7 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar3);
  fVar8 = ImVec2::operator[](in_RDI,(long)(int)uVar3);
  fVar7 = (fVar7 - fVar8) - 4.0;
  local_4c = (pIVar2->Style).GrabMinSize;
  if (in_R8 < in_R9) {
    local_f8 = in_R9 - in_R8;
  }
  else {
    local_f8 = in_R8 - in_R9;
  }
  local_84 = in_stack_fffffffffffffef8;
  if ((!bVar5 && !bVar6) && (-1 < local_f8)) {
    local_4c = ImMax<float>(fVar7 / (float)(local_f8 + 1),(pIVar2->Style).GrabMinSize);
    local_84 = in_stack_fffffffffffffef8;
  }
  zero_deadzone_halfsize_00 = (float)(in_R9 >> 0x20);
  fVar8 = ImMin<float>(local_4c,fVar7);
  fVar9 = fVar7 - fVar8;
  fVar10 = ImVec2::operator[](in_RDI,(long)(int)uVar3);
  fVar10 = fVar8 * 0.5 + fVar10 + 2.0;
  fVar11 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar3);
  if (bVar1) {
    if (bVar5 || bVar6) {
      in_stack_ffffffffffffff04 =
           ImParseFormatPrecision
                     ((char *)CONCAT44(in_stack_fffffffffffffefc,local_84),
                      (int)in_stack_fffffffffffffef4);
    }
    else {
      in_stack_ffffffffffffff04 = 1;
    }
    ImPow(0.0,5.20848e-39);
    in_stack_ffffffffffffff00 = (pIVar2->Style).LogSliderDeadzone * 0.5;
    ImMax<float>(fVar9,1.0);
  }
  local_71 = false;
  if (pIVar2->ActiveId == in_ESI) {
    bVar1 = false;
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar2->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        pfVar4 = ImVec2::operator[](&(pIVar2->IO).MousePos,(long)(int)uVar3);
        if (fVar9 <= 0.0) {
          in_stack_fffffffffffffefc = 0.0;
        }
        else {
          in_stack_fffffffffffffefc = ImClamp<float>((*pfVar4 - fVar10) / fVar9,0.0,1.0);
        }
        bVar1 = true;
      }
    }
    else if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
      if ((pIVar2->ActiveIdIsJustActivated & 1U) != 0) {
        pIVar2->SliderCurrentAccum = 0.0;
        pIVar2->SliderCurrentAccumDirty = false;
      }
      IVar14 = GetNavInputAmount2d(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,
                                   in_stack_ffffffffffffff24,in_stack_ffffffffffffff20);
      if (uVar3 == 0) {
        local_84 = IVar14.x;
      }
      else {
        fStack_80 = IVar14.y;
        local_84 = -fStack_80;
      }
      if ((local_84 != 0.0) || (NAN(local_84))) {
        fVar9 = local_84;
        if (bVar5 || bVar6) {
          in_stack_fffffffffffffef4 =
               (float)ImParseFormatPrecision
                                ((char *)CONCAT44(in_stack_fffffffffffffefc,local_84),
                                 (int)in_stack_fffffffffffffef4);
        }
        else {
          in_stack_fffffffffffffef4 = 0.0;
        }
        if ((int)in_stack_fffffffffffffef4 < 1) {
          if (((-100.0 <= (float)local_f8) && ((float)local_f8 <= 100.0)) ||
             (bVar5 = IsNavInputDown(0xe), bVar5)) {
            local_88 = (float)(~-(uint)(local_84 < 0.0) & 0x3f800000 |
                              -(uint)(local_84 < 0.0) & 0xbf800000) / (float)local_f8;
          }
          else {
            local_88 = local_84 / 100.0;
          }
        }
        else {
          local_88 = local_84 / 100.0;
          bVar5 = IsNavInputDown(0xe);
          if (bVar5) {
            local_88 = local_88 / 10.0;
          }
        }
        bVar5 = IsNavInputDown(0xf);
        if (bVar5) {
          local_88 = local_88 * 10.0;
        }
        pIVar2->SliderCurrentAccum = local_88 + pIVar2->SliderCurrentAccum;
        pIVar2->SliderCurrentAccumDirty = true;
        local_84 = fVar9;
      }
      fVar9 = pIVar2->SliderCurrentAccum;
      if ((pIVar2->NavActivatePressedId == in_ESI) && ((pIVar2->ActiveIdIsJustActivated & 1U) == 0))
      {
        ClearActiveID();
      }
      else if ((pIVar2->SliderCurrentAccumDirty & 1U) != 0) {
        fVar12 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                           (unaff_retaddr,(unsigned_long_long)in_RDI,CONCAT44(in_ESI,in_EDX),
                            (unsigned_long_long)in_RCX,SUB81(in_R8 >> 0x38,0),(float)in_R8,
                            zero_deadzone_halfsize_00);
        if (((1.0 <= fVar12) && (0.0 < fVar9)) || ((fVar12 <= 0.0 && (fVar9 < 0.0)))) {
          bVar1 = false;
          pIVar2->SliderCurrentAccum = 0.0;
        }
        else {
          bVar1 = true;
          ImSaturate(fVar12 + fVar9);
          ScaleValueFromRatioT<unsigned_long_long,long_long,double>
                    (in_stack_0000000c,in_stack_00000008,CONCAT44(unaff_retaddr_00,unaff_retaddr),
                     (unsigned_long_long)in_RDI,SUB41(in_ESI >> 0x18,0),in_EDX,
                     (float)((ulong)in_RCX >> 0x20));
          if ((in_stack_00000010 & 0x40) == 0) {
            RoundScalarWithFormatT<unsigned_long_long,long_long>
                      ((char *)in_stack_ffffffffffffff48,(ImGuiDataType)in_stack_ffffffffffffff44,
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          }
          fVar13 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                             (unaff_retaddr,(unsigned_long_long)in_RDI,CONCAT44(in_ESI,in_EDX),
                              (unsigned_long_long)in_RCX,SUB81(in_R8 >> 0x38,0),(float)in_R8,
                              zero_deadzone_halfsize_00);
          if (fVar9 <= 0.0) {
            fVar9 = ImMax<float>(fVar13 - fVar12,fVar9);
            pIVar2->SliderCurrentAccum = pIVar2->SliderCurrentAccum - fVar9;
          }
          else {
            fVar9 = ImMin<float>(fVar13 - fVar12,fVar9);
            pIVar2->SliderCurrentAccum = pIVar2->SliderCurrentAccum - fVar9;
          }
        }
        pIVar2->SliderCurrentAccumDirty = false;
      }
    }
    if (bVar1) {
      local_b0 = ScaleValueFromRatioT<unsigned_long_long,long_long,double>
                           (in_stack_0000000c,in_stack_00000008,
                            CONCAT44(unaff_retaddr_00,unaff_retaddr),(unsigned_long_long)in_RDI,
                            SUB41(in_ESI >> 0x18,0),in_EDX,(float)((ulong)in_RCX >> 0x20));
      if ((in_stack_00000010 & 0x40) == 0) {
        local_b0 = RoundScalarWithFormatT<unsigned_long_long,long_long>
                             ((char *)in_stack_ffffffffffffff48,
                              (ImGuiDataType)in_stack_ffffffffffffff44,
                              CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      }
      local_71 = *in_RCX != local_b0;
      if (local_71) {
        *in_RCX = local_b0;
      }
    }
  }
  if (1.0 <= fVar7) {
    fVar7 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                      (unaff_retaddr,(unsigned_long_long)in_RDI,CONCAT44(in_ESI,in_EDX),
                       (unsigned_long_long)in_RCX,SUB81(in_R8 >> 0x38,0),(float)in_R8,
                       zero_deadzone_halfsize_00);
    if (uVar3 == 1) {
      fVar7 = 1.0 - fVar7;
    }
    ImLerp<float>(fVar10,-fVar8 * 0.5 + (fVar11 - 2.0),fVar7);
    if (uVar3 == 0) {
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffefc,local_84,in_stack_fffffffffffffef4,
                     in_stack_fffffffffffffef0);
      *in_stack_00000018 = CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
      in_stack_00000018[1] = local_d0;
    }
    else {
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffefc,local_84,in_stack_fffffffffffffef4,
                     in_stack_fffffffffffffef0);
      *in_stack_00000018 = local_e8;
      in_stack_00000018[1] = CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20);
    }
  }
  else {
    ImRect::ImRect((ImRect *)&local_c0,in_RDI,in_RDI);
    *in_stack_00000018 = CONCAT44(in_stack_ffffffffffffff44,local_c0);
    *(ImVec2 *)(in_stack_00000018 + 1) = in_stack_ffffffffffffff48;
  }
  return local_71;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}